

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_hotspot.cxx
# Opt level: O2

void __thiscall Fl_Window::hotspot(Fl_Window *this,Fl_Widget *o,int offscreen)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int local_28;
  int iStack_24;
  
  uVar1 = o->w_;
  uVar3 = o->h_;
  local_28 = (int)uVar1 / 2;
  iStack_24 = (int)uVar3 / 2;
  for (; ((Fl_Window *)o != this && ((Fl_Window *)o != (Fl_Window *)0x0));
      o = (Fl_Widget *)Fl_Widget::window(o)) {
    uVar2 = (((Fl_Window *)o)->super_Fl_Group).super_Fl_Widget.x_;
    uVar4 = (((Fl_Window *)o)->super_Fl_Group).super_Fl_Widget.y_;
    local_28 = local_28 + uVar2;
    iStack_24 = iStack_24 + uVar4;
  }
  hotspot(this,local_28,iStack_24,offscreen);
  return;
}

Assistant:

void Fl_Window::hotspot(const Fl_Widget *o, int offscreen) {
  int X = o->w()/2;
  int Y = o->h()/2;
  while (o != this && o) {
    X += o->x(); Y += o->y();
    o = o->window();
  }
  hotspot(X,Y,offscreen);
}